

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.h
# Opt level: O2

void __thiscall
wasm::BinaryenIRWriter<wasm::StackIRGenerator>::visitBlock
          (BinaryenIRWriter<wasm::StackIRGenerator> *this,Block *curr)

{
  pointer ppBVar1;
  SpecificExpression<(wasm::Expression::Id)1> *pSVar2;
  Expression **ppEVar3;
  anon_class_8_1_8991fb9c aVar4;
  undefined1 auStack_58 [8];
  vector<wasm::Block_*,_std::allocator<wasm::Block_*>_> parents;
  anon_class_8_1_8991fb9c afterChildren;
  anon_class_8_1_8991fb9c visitChildren;
  Block *curr_local;
  
  afterChildren.this = this;
  visitChildren.this = (BinaryenIRWriter<wasm::StackIRGenerator> *)curr;
  if ((curr->name).super_IString.str._M_str == (char *)0x0) {
    visitBlock::anon_class_8_1_8991fb9c::operator()(&afterChildren,curr,0);
  }
  else {
    parents.super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)this;
    if (((curr->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
         usedElements == 0) ||
       (ppEVar3 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                            (&(curr->list).
                              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                             ,0), (*ppEVar3)->_id != BlockId)) {
      StackIRGenerator::emit((StackIRGenerator *)this,(Expression *)curr);
      visitBlock::anon_class_8_1_8991fb9c::operator()(&afterChildren,curr,0);
      visitBlock::anon_class_8_1_8991fb9c::operator()
                ((anon_class_8_1_8991fb9c *)
                 &parents.super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,curr);
    }
    else {
      auStack_58 = (undefined1  [8])0x0;
      parents.super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      parents.super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      while (aVar4.this = (BinaryenIRWriter<wasm::StackIRGenerator> *)curr,
            (curr->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
            usedElements != 0) {
        ppEVar3 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                            (&(curr->list).
                              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                             ,0);
        curr = (Block *)*ppEVar3;
        aVar4 = visitChildren;
        if ((curr->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id !=
            BlockId) break;
        std::vector<wasm::Block_*,_std::allocator<wasm::Block_*>_>::push_back
                  ((vector<wasm::Block_*,_std::allocator<wasm::Block_*>_> *)auStack_58,
                   (value_type *)&visitChildren);
        StackIRGenerator::emit((StackIRGenerator *)this,(Expression *)visitChildren.this);
        visitChildren.this = (BinaryenIRWriter<wasm::StackIRGenerator> *)curr;
      }
      StackIRGenerator::emit((StackIRGenerator *)this,(Expression *)aVar4.this);
      visitBlock::anon_class_8_1_8991fb9c::operator()(&afterChildren,(Block *)visitChildren.this,0);
      visitBlock::anon_class_8_1_8991fb9c::operator()
                ((anon_class_8_1_8991fb9c *)
                 &parents.super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(Block *)visitChildren.this);
      aVar4 = visitChildren;
      while (auStack_58 !=
             (undefined1  [8])
             parents.super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>._M_impl.
             super__Vector_impl_data._M_start) {
        ppBVar1 = parents.super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>._M_impl.
                  super__Vector_impl_data._M_start + -1;
        pSVar2 = &((Block *)aVar4.this)->super_SpecificExpression<(wasm::Expression::Id)1>;
        aVar4.this = (BinaryenIRWriter<wasm::StackIRGenerator> *)
                     parents.super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>.
                     _M_impl.super__Vector_impl_data._M_start[-1];
        parents.super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>._M_impl.
        super__Vector_impl_data._M_start = ppBVar1;
        if ((pSVar2->super_Expression).type.id != 1) {
          visitBlock::anon_class_8_1_8991fb9c::operator()(&afterChildren,(Block *)aVar4.this,1);
        }
        visitBlock::anon_class_8_1_8991fb9c::operator()
                  ((anon_class_8_1_8991fb9c *)
                   &parents.super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,(Block *)aVar4.this);
      }
      std::_Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>::~_Vector_base
                ((_Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_> *)auStack_58);
    }
  }
  return;
}

Assistant:

void BinaryenIRWriter<SubType>::visitBlock(Block* curr) {
  auto visitChildren = [this](Block* curr, Index from) {
    auto& list = curr->list;
    while (from < list.size()) {
      auto* child = list[from];
      visit(child);
      if (child->type == Type::unreachable) {
        break;
      }
      ++from;
    }
  };

  // A block with no name never needs to be emitted: we can just emit its
  // contents. In some cases that will end up as "stacky" code, which is valid
  // in wasm but not in Binaryen IR. This is similar to what we do in
  // visitPossibleBlockContents(), and like there, when we reload such a binary
  // we'll end up creating a block for it then.
  //
  // Note that in visitPossibleBlockContents() we also optimize the case of a
  // block with a name but the name actually has no uses - that handles more
  // cases, but it requires more work. It is reasonable to do it in
  // visitPossibleBlockContents() which handles the common cases of blocks that
  // are children of control flow structures (like an if arm); doing it here
  // would affect every block, including highly-nested block stacks, which would
  // end up as quadratic time. In optimized code the name will not exist if it's
  // not used anyhow, so a minor optimization for the unoptimized case that
  // leads to potential quadratic behavior is not worth it here.
  if (!curr->name.is()) {
    visitChildren(curr, 0);
    return;
  }

  auto afterChildren = [this](Block* curr) {
    emitScopeEnd(curr);
    if (curr->type == Type::unreachable) {
      // Since this block is unreachable, no instructions will be emitted after
      // it in its enclosing scope. That means that this block will be the last
      // instruction before the end of its parent scope, so its type must match
      // the type of its parent. But we don't have a concrete type for this
      // block and we don't know what type its parent expects, so we can't
      // ensure the types match. To work around this, we insert an `unreachable`
      // instruction after every unreachable control flow structure and depend
      // on its polymorphic behavior to paper over any type mismatches.
      emitUnreachable();
    }
  };

  // Handle very deeply nested blocks in the first position efficiently,
  // avoiding heavy recursion. We only start to do this if we see it will help
  // us (to avoid allocation of the vector).
  if (!curr->list.empty() && curr->list[0]->is<Block>()) {
    std::vector<Block*> parents;
    Block* child;
    while (!curr->list.empty() && (child = curr->list[0]->dynCast<Block>())) {
      parents.push_back(curr);
      emit(curr);
      curr = child;
      emitDebugLocation(curr);
    }
    // Emit the current block, which does not have a block as a child in the
    // first position.
    emit(curr);
    visitChildren(curr, 0);
    afterChildren(curr);
    bool childUnreachable = curr->type == Type::unreachable;
    // Finish the later parts of all the parent blocks.
    while (!parents.empty()) {
      auto* parent = parents.back();
      parents.pop_back();
      if (!childUnreachable) {
        visitChildren(parent, 1);
      }
      afterChildren(parent);
      childUnreachable = parent->type == Type::unreachable;
    }
    return;
  }
  // Simple case of not having a nested block in the first position.
  emit(curr);
  visitChildren(curr, 0);
  afterChildren(curr);
}